

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,short,std::__cxx11::string>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,v10 *this,void **args,short *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  longlong lVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  short *args_local_1;
  void **args_local;
  undefined1 local_104;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  bool formattable;
  bool formattable_pointer;
  v10 *pvStack_100;
  bool formattable_char;
  undefined1 local_f8 [8];
  size_t local_f0;
  longlong local_e8;
  undefined1 *local_e0;
  longlong local_d8;
  undefined1 *local_d0;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  bool formattable_1;
  bool formattable_pointer_1;
  void **ppvStack_c0;
  bool formattable_char_1;
  longlong local_b8;
  size_t local_b0;
  int local_9c;
  longlong *local_98;
  undefined1 local_89;
  char *local_88;
  size_t local_80;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  bool formattable_2;
  bool formattable_pointer_2;
  short *psStack_70;
  bool formattable_char_2;
  char *local_68 [3];
  short *local_50;
  undefined1 *local_48;
  basic_string_view<char> local_40;
  char **local_30;
  basic_string_view<char> local_28;
  short local_12;
  undefined1 *local_10;
  
  local_101 = 1;
  local_102 = 1;
  local_103 = 1;
  lVar1 = *(longlong *)this;
  local_e0 = &local_104;
  local_d0 = local_f8;
  local_c1 = 1;
  local_c2 = 1;
  local_c3 = 1;
  local_12 = *(short *)args;
  local_10 = &local_c4;
  local_9c = (int)local_12;
  local_98 = &local_b8;
  local_b8._0_4_ = local_9c;
  local_71 = 1;
  local_72 = 1;
  local_73 = 1;
  local_48 = &local_89;
  pvStack_100 = this;
  local_e8 = lVar1;
  local_d8 = lVar1;
  ppvStack_c0 = args;
  psStack_70 = args_1;
  local_50 = args_1;
  local_40 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1)
  ;
  local_88 = local_40.data_;
  local_80 = local_40.size_;
  local_28.data_ = local_40.data_;
  local_28.size_ = local_40.size_;
  local_30 = local_68;
  local_68[0] = basic_string_view<char>::data(&local_28);
  sVar2 = basic_string_view<char>::size(&local_28);
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = lVar1;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_f0;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_b8;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_b0;
  (__return_storage_ptr__->data_).args_[2].field_0.string.data = local_68[0];
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = sVar2;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}